

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

void Abc_NtkPrintFinResults(Vec_Wec_t *vClasses)

{
  Vec_Int_t *pVVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (0 < vClasses->nSize) {
    lVar4 = 0;
    do {
      pVVar1 = vClasses->pArray;
      uVar2 = (ulong)(uint)pVVar1[lVar4].nSize;
      if (1 < pVVar1[lVar4].nSize) {
        lVar3 = 1;
        do {
          if ((int)uVar2 < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          printf("%d %d\n",(ulong)(uint)*pVVar1[lVar4].pArray,
                 (ulong)(uint)pVVar1[lVar4].pArray[lVar3]);
          lVar3 = lVar3 + 1;
          uVar2 = (ulong)pVVar1[lVar4].nSize;
        } while (lVar3 < (long)uVar2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vClasses->nSize);
  }
  return;
}

Assistant:

void Abc_NtkPrintFinResults( Vec_Wec_t * vClasses )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    Vec_WecForEachLevel( vClasses, vClass, i )
        Vec_IntForEachEntryStart( vClass, Entry, k, 1 )
            printf( "%d %d\n", Vec_IntEntry(vClass, 0), Entry );
}